

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

MauResult __thiscall
mau::ProxySession::Initialize
          (ProxySession *this,char *serverHostname,uint16_t serverPort,MauProxyConfig *proxyConfig,
          MauChannelConfig *channelConfig)

{
  shared_ptr<asio::io_context> *this_00;
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_01;
  undefined1 *this_02;
  uint32_t uVar1;
  basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *pbVar2;
  long lVar3;
  io_context_impl *piVar4;
  MauAppContextPtr pvVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  io_context *piVar13;
  basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
  *this_03;
  basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *this_04;
  basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this_05;
  error_category *peVar14;
  OutputWorker *this_06;
  thread *this_07;
  uint8_t *readBuffer;
  operation *op;
  socklen_t __len;
  MauProxyConfig *pMVar15;
  MauResult MVar16;
  pointer __p_3;
  pointer __p_2;
  char *pcVar17;
  resolver_service_base *this_08;
  pointer __p;
  allocator local_2b1;
  char *local_2b0;
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [24];
  error_code error_1;
  string local_218;
  error_code error;
  UDPAddress bindAddress;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  ostringstream oss;
  
  (this->super_DeliveryCommonData).ProxyConfig.SendHook = proxyConfig->SendHook;
  uVar1 = proxyConfig->UDPSendBufferSizeBytes;
  uVar6 = proxyConfig->UDPRecvBufferSizeBytes;
  uVar7 = proxyConfig->UDPListenPort;
  uVar8 = proxyConfig->MaxDatagramBytes;
  uVar9 = *(undefined4 *)&proxyConfig->field_0x14;
  pvVar5 = proxyConfig->SendHookContext;
  (this->super_DeliveryCommonData).ProxyConfig.Version = proxyConfig->Version;
  (this->super_DeliveryCommonData).ProxyConfig.UDPSendBufferSizeBytes = uVar1;
  (this->super_DeliveryCommonData).ProxyConfig.UDPRecvBufferSizeBytes = uVar6;
  (this->super_DeliveryCommonData).ProxyConfig.UDPListenPort = uVar7;
  (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes = uVar8;
  *(undefined4 *)&(this->super_DeliveryCommonData).ProxyConfig.field_0x14 = uVar9;
  (this->super_DeliveryCommonData).ProxyConfig.SendHookContext = pvVar5;
  pMVar15 = proxyConfig;
  LockedValue<MauChannelConfig_t>::Set
            (&(this->super_DeliveryCommonData).ChannelConfig,channelConfig);
  __len = (socklen_t)pMVar15;
  std::__cxx11::string::assign((char *)&this->ServerHostname);
  this->ServerPort = serverPort;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar12 = std::operator<<(&oss.super_basic_ostream<char,_std::char_traits<char>_>,"[Port ");
  std::__cxx11::to_string((string *)&error_1,proxyConfig->UDPListenPort);
  poVar12 = std::operator<<(poVar12,(string *)&error_1);
  std::operator<<(poVar12,"] ");
  std::__cxx11::string::~string((string *)&error_1);
  std::__cxx11::stringbuf::str();
  logger::Channel::SetPrefix((Channel *)this,(string *)&error_1);
  std::__cxx11::string::~string((string *)&error_1);
  piVar13 = (io_context *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (piVar13 != (io_context *)0x0) {
    asio::io_context::io_context(piVar13);
  }
  std::__shared_ptr<asio::io_context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<asio::io_context,void>
            ((__shared_ptr<asio::io_context,(__gnu_cxx::_Lock_policy)2> *)&error_1,piVar13);
  this_00 = &(this->super_DeliveryCommonData).Context;
  std::__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)&error_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&error_1._M_cat);
  piVar13 = (this->super_DeliveryCommonData).Context.
            super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  MVar16 = Mau_OOM;
  if (piVar13 != (io_context *)0x0) {
    asio::io_context::restart(piVar13);
    piVar13 = (this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_03 = (basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
               *)operator_new(0x40,(nothrow_t *)&std::nothrow);
    if (this_03 !=
        (basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
         *)0x0) {
      asio::
      basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ::basic_io_object(this_03,piVar13);
    }
    error_1._M_value = 0;
    error_1._4_4_ = 0;
    std::
    __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
             *)&this->Ticker,(pointer)this_03);
    std::
    unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                   *)&error_1);
    piVar13 = (this->super_DeliveryCommonData).Context.
              super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_04 = (basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *)
              operator_new(0x20,(nothrow_t *)&std::nothrow);
    if (this_04 != (basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *)0x0) {
      asio::basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>::basic_io_object
                (this_04,piVar13);
    }
    this_01 = &(this->super_DeliveryCommonData).Socket;
    error_1._M_value = 0;
    error_1._4_4_ = 0;
    local_2b0 = serverHostname;
    std::
    __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             *)this_01,(pointer)this_04);
    std::
    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   *)&error_1);
    piVar13 = (this->super_DeliveryCommonData).Context.
              super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_05 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)
              operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (this_05 != (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0) {
      asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::basic_io_object
                (this_05,piVar13);
    }
    error_1._M_value = 0;
    error_1._4_4_ = 0;
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&this->Resolver,(pointer)this_05);
    std::
    unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::~unique_ptr((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                   *)&error_1);
    if ((((this->super_DeliveryCommonData).Socket._M_t.
          super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
          .
          super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
          ._M_head_impl !=
          (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0
         ) && ((this->Resolver)._M_t.
               super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               .
               super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
               ._M_head_impl !=
               (basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)0x0)) &&
       ((this->Ticker)._M_t.
        super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
        .
        super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
        ._M_head_impl !=
        (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         *)0x0)) {
      postNextTimer(this);
      bVar10 = DeliveryChannel::Initialize(&this->S2C,&this->super_DeliveryCommonData);
      if (bVar10) {
        bVar10 = DeliveryChannel::Initialize(&this->C2S,&this->super_DeliveryCommonData);
        if (bVar10) {
          bindAddress.impl_.data_.v6.sin6_scope_id = 0;
          bindAddress.impl_.data_._8_1_ = '\0';
          bindAddress.impl_.data_._9_1_ = '\0';
          bindAddress.impl_.data_._10_1_ = '\0';
          bindAddress.impl_.data_._11_1_ = '\0';
          bindAddress.impl_.data_._12_1_ = '\0';
          bindAddress.impl_.data_._13_1_ = '\0';
          bindAddress.impl_.data_._14_1_ = '\0';
          bindAddress.impl_.data_._15_1_ = '\0';
          bindAddress.impl_.data_._16_8_ = 0;
          bindAddress.impl_.data_.base.sa_family = 2;
          error._M_value = 0;
          bindAddress.impl_.data_.v4.sin_port =
               swap_bytes((short)(this->super_DeliveryCommonData).ProxyConfig.UDPListenPort);
          bindAddress.impl_.data_.v6.sin6_flowinfo = 0;
          peVar14 = (error_category *)std::_V2::system_category();
          error_1._M_value = 2;
          error._M_cat = peVar14;
          asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::open
                    (&((this->super_DeliveryCommonData).Socket._M_t.
                       super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                       .
                       super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                      ._M_head_impl)->
                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                     ,(char *)&error_1,(int)&error);
          if (error._M_value == 0) {
            asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
                      (&((this_01->_M_t).
                         super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                         .
                         super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                        ._M_head_impl)->
                        super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                       ,(int)&bindAddress,(sockaddr *)&error,__len);
            MVar16 = Mau_PortInUse;
            if (error._M_value == 0) {
              uVar1 = (this->super_DeliveryCommonData).ProxyConfig.UDPRecvBufferSizeBytes;
              error_1._0_8_ = error_1._0_8_ & 0xffffffff00000000;
              local_218._M_dataplus._M_p._0_4_ =
                   (this->super_DeliveryCommonData).ProxyConfig.UDPSendBufferSizeBytes;
              error_1._M_cat = peVar14;
              asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
              set_option<asio::detail::socket_option::integer<1,7>>
                        ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *
                         )(this->super_DeliveryCommonData).Socket._M_t.
                          super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          .
                          super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                          ._M_head_impl,(integer<1,_7> *)&local_218,&error_1);
              if (error_1._M_value == 0) {
                local_218._M_dataplus._M_p._0_4_ = uVar1;
                asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
                set_option<asio::detail::socket_option::integer<1,8>>
                          ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>
                            *)(this_01->_M_t).
                              super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                              .
                              super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                              ._M_head_impl,(integer<1,_8> *)&local_218,&error_1);
                if (error_1._M_value == 0) {
                  local_218._M_dataplus._M_p._0_4_ = 1;
                  asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
                  set_option<asio::detail::socket_option::boolean<1,2>>
                            ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>
                              *)(this_01->_M_t).
                                super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                                .
                                super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                                ._M_head_impl,(boolean<1,_2> *)&local_218,&error_1);
                  if (error_1._M_value == 0) {
                    error_1._0_8_ = workerLoop;
                    error_1._M_cat = (error_category *)0x0;
                    local_2a0._0_8_ = this;
                    this_07 = (thread *)operator_new(8,(nothrow_t *)&std::nothrow);
                    if (this_07 != (thread *)0x0) {
                      std::thread::thread<void(mau::ProxySession::*)(),mau::ProxySession*,void>
                                (this_07,(type *)&error_1,(ProxySession **)local_2a0);
                    }
                    local_218._M_dataplus._M_p = (pointer)0x0;
                    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                               &this->Thread,this_07);
                    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
                               &local_218);
                    MVar16 = Mau_OOM;
                    if ((this->Thread)._M_t.
                        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
                        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
                      uVar1 = (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes;
                      error_1._0_8_ = &(this->super_DeliveryCommonData).ReadBufferAllocator;
                      std::recursive_mutex::lock((recursive_mutex *)error_1._0_8_);
                      pcVar17 = local_2b0;
                      readBuffer = pktalloc::Allocator::Allocate
                                             (&(this->super_DeliveryCommonData).ReadBufferAllocator.
                                               Allocator,uVar1 + 0x1c);
                      Locker::~Locker((Locker *)&error_1);
                      if (readBuffer != (uint8_t *)0x0) {
                        postNextRead(this,readBuffer);
                        if (Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                            ::kAnyProtocolStr_abi_cxx11_ == '\0') {
                          iVar11 = __cxa_guard_acquire(&
                                                  Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                                  ::kAnyProtocolStr_abi_cxx11_);
                          if (iVar11 != 0) {
                            std::__cxx11::string::string
                                      ((string *)
                                       &Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                        ::kAnyProtocolStr_abi_cxx11_,"",(allocator *)&error_1);
                            __cxa_atexit(std::__cxx11::string::~string,
                                         &Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                          ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
                            __cxa_guard_release(&Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                                 ::kAnyProtocolStr_abi_cxx11_);
                            pcVar17 = local_2b0;
                          }
                        }
                        pbVar2 = (this->Resolver)._M_t.
                                 super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                                 .
                                 super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
                                 ._M_head_impl;
                        std::__cxx11::string::string((string *)&local_218,pcVar17,&local_2b1);
                        local_2a8 = (undefined1  [8])this;
                        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                                  ((basic_resolver_query<asio::ip::tcp> *)&error_1,&local_218,
                                   &Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                    ::kAnyProtocolStr_abi_cxx11_,0);
                        lVar3 = (long)(pbVar2->
                                      super_basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>
                                      ).service_;
                        local_2a0._0_8_ = local_2a8;
                        op = (operation *)asio::asio_handler_allocate(0xc0);
                        local_2a0._16_8_ = 0;
                        this_08 = (resolver_service_base *)(lVar3 + 0x28);
                        local_2a0._8_8_ = op;
                        std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void,void>
                                  ((__weak_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_1c8,
                                   &(pbVar2->
                                    super_basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>
                                    ).implementation_.
                                    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
                        piVar4 = this_08->io_context_impl_;
                        op->next_ = (scheduler_operation *)0x0;
                        op->func_ = asio::detail::
                                    resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
                                    ::do_complete;
                        op->task_result_ = 0;
                        std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                                  ((__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(op + 1),
                                   &local_1c8);
                        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                                  ((basic_resolver_query<asio::ip::tcp> *)&op[1].task_result_,
                                   (basic_resolver_query<asio::ip::tcp> *)&error_1);
                        op[6].func_ = (func_type)piVar4;
                        *(undefined1 (*) [8])&op[6].task_result_ = local_2a8;
                        std::error_code::error_code((error_code *)(op + 7));
                        *(undefined8 *)&op[7].task_result_ = 0;
                        local_2a0._16_8_ = op;
                        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                                  (&local_1c8._M_refcount);
                        asio::detail::resolver_service_base::start_resolve_op(this_08,op);
                        local_2a0._8_8_ = 0;
                        local_2a0._16_8_ = 0;
                        asio::detail::
                        resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
                        ::ptr::~ptr((ptr *)local_2a0);
                        asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
                                  ((basic_resolver_query<asio::ip::tcp> *)&error_1);
                        std::__cxx11::string::~string((string *)&local_218);
                        MVar16 = Mau_Success;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            MVar16 = Mau_NetworkFailed;
          }
        }
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  LOCK();
  (this->super_DeliveryCommonData).LastResult._M_i = MVar16;
  UNLOCK();
  if (MVar16 == Mau_Success) {
    MVar16 = Mau_Success;
  }
  else {
    if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 5) {
      oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)(this->super_DeliveryCommonData).Logger.ChannelName;
      this_02 = &oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      oss.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
      std::operator<<((ostream *)this_02,(string *)&(this->super_DeliveryCommonData).Logger.Prefix);
      std::operator<<((ostream *)this_02,"ProxySession::Initialize failed: ");
      std::ostream::operator<<(this_02,MVar16);
      this_06 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_06,(LogStringBuffer *)&oss);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
    }
    Shutdown(this);
  }
  return MVar16;
}

Assistant:

MauResult ProxySession::Initialize(
    const char* serverHostname,
    uint16_t serverPort,
    const MauProxyConfig& proxyConfig,
    const MauChannelConfig& channelConfig)
{
    MauResult result = Mau_Success;

    try
    {
        ProxyConfig = proxyConfig;
        ChannelConfig.Set(channelConfig);
        ServerHostname = serverHostname;
        ServerPort = serverPort;

        // Set logger prefix
        std::ostringstream oss;
        oss << "[Port " << std::to_string(proxyConfig.UDPListenPort) << "] ";
        Logger.SetPrefix(oss.str());

        Context = MakeSharedNoThrow<asio::io_context>();
        if (!Context)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }
        Context->restart();

        // Create Asio objects
        Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Context);
        Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Context);
        if (!Socket || !Resolver || !Ticker)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextTimer();

        // Initialize S2C channel
        if (!S2C.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Initialize C2S channel
        if (!C2S.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Create an IPv4/IPv6 socket based on the server address type
        const UDPAddress bindAddress(asio::ip::udp::v4(), ProxyConfig.UDPListenPort);

        asio::error_code error;
        Socket->open(bindAddress.protocol(), error);
        if (error)
        {
            result = Mau_NetworkFailed;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Socket->bind(bindAddress, error);
        if (error)
        {
            result = Mau_PortInUse;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        if (!SetSocketOptions(
            Socket,
            "UDPSocket",
            ProxyConfig.UDPSendBufferSizeBytes,
            ProxyConfig.UDPRecvBufferSizeBytes))
        {
            result = Mau_SocketCreation;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Thread = MakeUniqueNoThrow<std::thread>(&ProxySession::workerLoop, this);
        if (!Thread)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
        if (!readBuffer)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextRead(readBuffer);

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        Resolver->async_resolve(std::string(serverHostname), kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            asio::ip::address addr = firstIPv4AddressInResults(results);

            if (addr.is_unspecified())
            {
                Logger.Error("Unable to resolve server hostname: ", ServerHostname);
                LastResult = Mau_HostnameLookup;
            }
            else
            {
                const UDPAddress serverAddress(addr, ServerPort);
                ServerAddress.Set(serverAddress);
                C2S.SetDeliveryAddress(serverAddress);

                Logger.Info("Resolved server address to ", serverAddress.address().to_string(), " : ", serverAddress.port());
            }
        });
    }
    catch (...)
    {
        result = Mau_Error;
        goto OnError;
    }

OnError:
    LastResult = result;
    if (MAU_FAILED(result))
    {
        Logger.Error("ProxySession::Initialize failed: ", result);
        Shutdown();
    }

    return result;
}